

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_group_ops(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer ppLVar4;
  pointer ppLVar5;
  size_t sVar6;
  int *piVar7;
  long *plVar8;
  ulong uVar9;
  Layer *pLVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  void *in_R8;
  int i;
  long lVar14;
  uint uVar15;
  uint i_00;
  bool bVar16;
  int local_180;
  Mat local_178;
  void *local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  int iStack_118;
  Allocator *local_110;
  uint local_108;
  undefined4 uStack_104;
  uint uStack_100;
  ulong uStack_fc;
  long local_f0;
  int local_e4;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_e0;
  long local_d8;
  Allocator *local_d0;
  size_t local_c8;
  ulong local_c0;
  Mat local_b8;
  long local_70;
  Option *local_68;
  Mat *local_60;
  size_t local_58;
  ModelBinFromMatArray local_50;
  ParamDict pd;
  
  iVar1 = (this->super_DeconvolutionDepthWise).num_output;
  iVar13 = (this->super_DeconvolutionDepthWise).kernel_h *
           (this->super_DeconvolutionDepthWise).kernel_w;
  iVar2 = (this->super_DeconvolutionDepthWise).group;
  uVar9 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)iVar2;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)iVar13;
  local_e0 = &this->group_ops;
  lVar14 = 0;
  local_68 = opt;
  while( true ) {
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3) <= lVar14) break;
    if (ppLVar4[lVar14] != (Layer *)0x0) {
      (*ppLVar4[lVar14]->_vptr_Layer[1])();
    }
    lVar14 = lVar14 + 1;
  }
  if (ppLVar5 != ppLVar4) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  iVar3 = (this->super_DeconvolutionDepthWise).group;
  i_00 = (this->super_DeconvolutionDepthWise).num_output / iVar3;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_e0,(long)iVar3);
  local_e4 = (((int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                    (long)(iVar1 / iVar2)) * iVar2) / iVar3) * iVar13 * i_00;
  local_58 = (size_t)local_e4;
  local_70 = (long)(int)i_00;
  local_60 = &(this->super_DeconvolutionDepthWise).activation_params;
  for (lVar14 = 0; lVar14 < (this->super_DeconvolutionDepthWise).group; lVar14 = lVar14 + 1) {
    sVar6 = (this->super_DeconvolutionDepthWise).weight_data.elemsize;
    local_178.data =
         (void *)(lVar14 * local_58 * sVar6 +
                 (long)(this->super_DeconvolutionDepthWise).weight_data.data);
    local_178.elempack = (this->super_DeconvolutionDepthWise).weight_data.elempack;
    local_178.allocator = (this->super_DeconvolutionDepthWise).weight_data.allocator;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = (undefined4)sVar6;
    local_178.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
    local_178.dims = 1;
    local_178.w = (int)local_58;
    local_178.h = 1;
    local_178.d = 1;
    local_178.cstep = local_58;
    local_178.c = local_178.dims;
    Mat::clone(&local_b8,(__fn *)&local_178,(void *)0x0,1,in_R8);
    piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          free(local_178.data);
        }
        else {
          (**(code **)(*(long *)local_178.allocator + 0x18))();
        }
      }
    }
    bVar16 = (this->super_DeconvolutionDepthWise).bias_term == 0;
    if (bVar16) {
      local_c0 = 0;
      local_d0 = (Allocator *)0x0;
      local_180 = 0;
      local_c8 = 0;
      pvVar11 = (void *)0x0;
      local_d8 = 0;
    }
    else {
      local_c8 = (this->super_DeconvolutionDepthWise).bias_data.elemsize;
      pvVar11 = (void *)(lVar14 * local_70 * local_c8 +
                        (long)(this->super_DeconvolutionDepthWise).bias_data.data);
      local_180 = (this->super_DeconvolutionDepthWise).bias_data.elempack;
      local_d0 = (this->super_DeconvolutionDepthWise).bias_data.allocator;
      local_c0 = (ulong)i_00;
      local_d8 = local_70;
    }
    bVar16 = !bVar16;
    uVar15 = (uint)bVar16;
    pLVar10 = create_layer_cpu(8);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,(this->super_DeconvolutionDepthWise).kernel_w);
    ParamDict::set(&pd,0xb,(this->super_DeconvolutionDepthWise).kernel_h);
    ParamDict::set(&pd,2,(this->super_DeconvolutionDepthWise).dilation_w);
    ParamDict::set(&pd,0xc,(this->super_DeconvolutionDepthWise).dilation_h);
    ParamDict::set(&pd,3,(this->super_DeconvolutionDepthWise).stride_w);
    ParamDict::set(&pd,0xd,(this->super_DeconvolutionDepthWise).stride_h);
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,0x12,(this->super_DeconvolutionDepthWise).output_pad_right);
    ParamDict::set(&pd,0x13,(this->super_DeconvolutionDepthWise).output_pad_bottom);
    ParamDict::set(&pd,5,(this->super_DeconvolutionDepthWise).bias_term);
    ParamDict::set(&pd,6,local_e4);
    ParamDict::set(&pd,9,(this->super_DeconvolutionDepthWise).activation_type);
    ParamDict::set(&pd,10,local_60);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    local_178.refcount._0_4_ = SUB84(local_b8.refcount,0);
    local_178.refcount._4_4_ = (undefined4)((ulong)local_b8.refcount >> 0x20);
    local_178.elemsize._0_4_ = (undefined4)local_b8.elemsize;
    local_178.elemsize._4_4_ = (undefined4)(local_b8.elemsize >> 0x20);
    if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      local_178.data = local_b8.data;
      local_178.elempack = local_b8.elempack;
      local_178.allocator = local_b8.allocator;
      local_178.c = local_b8.c;
      local_178.cstep = local_b8.cstep;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_50);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
      piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (**(code **)(*(long *)local_178.allocator + 0x18))();
          }
        }
      }
    }
    else {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      local_178.cstep = local_b8.cstep;
      local_178.c = local_b8.c;
      local_178.allocator = local_b8.allocator;
      local_178.elempack = local_b8.elempack;
      local_178.data = local_b8.data;
      uStack_128 = 0;
      uStack_124 = 0;
      uStack_120 = (undefined4)local_c8;
      uStack_11c = (undefined4)(local_c8 >> 0x20);
      iStack_118 = local_180;
      local_110 = local_d0;
      uStack_104 = (undefined4)local_c0;
      uStack_fc = (ulong)CONCAT14(bVar16,uVar15);
      local_f0 = local_d8;
      local_130 = pvVar11;
      local_108 = uVar15;
      uStack_100 = uVar15;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_50);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
      lVar12 = 0x48;
      do {
        piVar7 = *(int **)((long)&local_178.refcount + lVar12);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            plVar8 = *(long **)((long)&local_178.allocator + lVar12);
            if (plVar8 == (long *)0x0) {
              free(*(void **)((long)&local_178.data + lVar12));
            }
            else {
              (**(code **)(*plVar8 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_178.cstep + lVar12) = 0;
        *(undefined8 *)((long)&local_178.refcount + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_178.elemsize + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_178.data + lVar12) = 0;
        *(undefined8 *)((long)&local_178.refcount + lVar12) = 0;
        *(undefined4 *)((long)&local_178.c + lVar12) = 0;
        *(undefined8 *)((long)&local_178.dims + lVar12) = 0;
        *(undefined8 *)((long)&local_178.h + lVar12) = 0;
        lVar12 = lVar12 + -0x48;
      } while (lVar12 != -0x48);
    }
    (*pLVar10->_vptr_Layer[4])(pLVar10,local_68);
    (local_e0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar14] = pLVar10;
    ParamDict::~ParamDict(&pd);
    if (local_b8.refcount != (int *)0x0) {
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
        }
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Deconvolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(18, output_pad_right);
        pd.set(19, output_pad_bottom);
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}